

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O2

bool __thiscall
HeadersSyncState::ValidateAndStoreHeadersCommitments
          (HeadersSyncState *this,vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers)

{
  pointer pCVar1;
  bool bVar2;
  bool bVar3;
  base_blob<256U> *b;
  arith_uint256 *b_00;
  uint256 *a;
  arith_uint256 *this_00;
  CBlockHeader *hdr;
  pointer pCVar4;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  base_blob<256U> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar4 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar3 = true;
  if ((headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
      super__Vector_impl_data._M_finish != pCVar4) {
    if (this->m_download_state == PRESYNC) {
      a = &pCVar4->hashPrevBlock;
      b = &local_50;
      CBlockHeader::GetHash((uint256 *)b,&this->m_last_header_received);
      bVar2 = ::operator!=(&a->super_base_blob<256U>,b);
      if (bVar2) {
        bVar3 = ::LogAcceptCategory((LogFlags)a,(Level)b);
        if (bVar3) {
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/headerssync.cpp"
          ;
          source_file._M_len = 0x5f;
          logging_function._M_str = "ValidateAndStoreHeadersCommitments";
          logging_function._M_len = 0x22;
          LogPrintFormatInternal<long,long>
                    (logging_function,source_file,0x9a,NET,Debug,(ConstevalFormatString<2U>)0xc8d9a5
                     ,&this->m_id,&this->m_current_height);
        }
      }
      else {
        pCVar4 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pCVar1 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        do {
          if (pCVar4 == pCVar1) {
            bVar2 = operator>=(&(this->m_current_chain_work).super_base_uint<256U>,
                               &(this->m_minimum_required_work).super_base_uint<256U>);
            if (bVar2) {
              std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::clear
                        (&this->m_redownloaded_headers);
              this->m_redownload_buffer_last_height = (long)this->m_chain_start->nHeight;
              CBlockIndex::GetBlockHash((uint256 *)&local_50,this->m_chain_start);
              *(undefined8 *)
               ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems +
               0x10) = local_50.m_data._M_elems._16_8_;
              *(undefined8 *)
               ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems +
               0x18) = local_50.m_data._M_elems._24_8_;
              *(undefined8 *)
               (this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems =
                   local_50.m_data._M_elems._0_8_;
              *(undefined8 *)
               ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems +
               8) = local_50.m_data._M_elems._8_8_;
              CBlockIndex::GetBlockHash((uint256 *)&local_50,this->m_chain_start);
              *(undefined8 *)
               ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 0x10)
                   = local_50.m_data._M_elems._16_8_;
              *(undefined8 *)
               ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 0x18)
                   = local_50.m_data._M_elems._24_8_;
              *(undefined8 *)
               (this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems =
                   local_50.m_data._M_elems._0_8_;
              *(undefined8 *)
               ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 8) =
                   local_50.m_data._M_elems._8_8_;
              b_00 = &this->m_chain_start->nChainWork;
              this_00 = &this->m_redownload_chain_work;
              base_uint<256U>::operator=
                        (&this_00->super_base_uint<256U>,&b_00->super_base_uint<256U>);
              this->m_download_state = REDOWNLOAD;
              bVar2 = ::LogAcceptCategory((LogFlags)this_00,(Level)b_00);
              if (bVar2) {
                source_file_00._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/headerssync.cpp"
                ;
                source_file_00._M_len = 0x5f;
                logging_function_00._M_str = "ValidateAndStoreHeadersCommitments";
                logging_function_00._M_len = 0x22;
                LogPrintFormatInternal<long,long,long>
                          (logging_function_00,source_file_00,0xad,NET,Debug,
                           (ConstevalFormatString<3U>)0xc8da05,&this->m_id,&this->m_current_height,
                           &this->m_redownload_buffer_last_height);
              }
            }
            goto LAB_006c628e;
          }
          bVar2 = ValidateAndProcessSingleHeader(this,pCVar4);
          pCVar4 = pCVar4 + 1;
        } while (bVar2);
      }
    }
    bVar3 = false;
  }
LAB_006c628e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool HeadersSyncState::ValidateAndStoreHeadersCommitments(const std::vector<CBlockHeader>& headers)
{
    // The caller should not give us an empty set of headers.
    Assume(headers.size() > 0);
    if (headers.size() == 0) return true;

    Assume(m_download_state == State::PRESYNC);
    if (m_download_state != State::PRESYNC) return false;

    if (headers[0].hashPrevBlock != m_last_header_received.GetHash()) {
        // Somehow our peer gave us a header that doesn't connect.
        // This might be benign -- perhaps our peer reorged away from the chain
        // they were on. Give up on this sync for now (likely we will start a
        // new sync with a new starting point).
        LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: non-continuous headers at height=%i (presync phase)\n", m_id, m_current_height);
        return false;
    }

    // If it does connect, (minimally) validate and occasionally store
    // commitments.
    for (const auto& hdr : headers) {
        if (!ValidateAndProcessSingleHeader(hdr)) {
            return false;
        }
    }

    if (m_current_chain_work >= m_minimum_required_work) {
        m_redownloaded_headers.clear();
        m_redownload_buffer_last_height = m_chain_start->nHeight;
        m_redownload_buffer_first_prev_hash = m_chain_start->GetBlockHash();
        m_redownload_buffer_last_hash = m_chain_start->GetBlockHash();
        m_redownload_chain_work = m_chain_start->nChainWork;
        m_download_state = State::REDOWNLOAD;
        LogDebug(BCLog::NET, "Initial headers sync transition with peer=%d: reached sufficient work at height=%i, redownloading from height=%i\n", m_id, m_current_height, m_redownload_buffer_last_height);
    }
    return true;
}